

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_external.cpp
# Opt level: O1

void duckdb::RowOperations::SwizzleHeapPointer
               (RowLayout *layout,data_ptr_t row_ptr,data_ptr_t heap_base_ptr,idx_t count,
               idx_t base_offset)

{
  idx_t iVar1;
  long *plVar2;
  long lVar3;
  
  if (count != 0) {
    iVar1 = layout->row_width;
    plVar2 = (long *)(row_ptr + layout->heap_pointer_offset);
    lVar3 = 0;
    do {
      *plVar2 = lVar3 + base_offset;
      lVar3 = lVar3 + (ulong)*(uint *)(heap_base_ptr + lVar3);
      plVar2 = (long *)((long)plVar2 + iVar1);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void RowOperations::SwizzleHeapPointer(const RowLayout &layout, data_ptr_t row_ptr, const data_ptr_t heap_base_ptr,
                                       const idx_t count, const idx_t base_offset) {
	const idx_t row_width = layout.GetRowWidth();
	row_ptr += layout.GetHeapOffset();
	idx_t cumulative_offset = 0;
	for (idx_t i = 0; i < count; i++) {
		Store<idx_t>(base_offset + cumulative_offset, row_ptr);
		cumulative_offset += Load<uint32_t>(heap_base_ptr + cumulative_offset);
		row_ptr += row_width;
	}
}